

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

unique_ptr<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>_> __thiscall
wallet::DescriptorScriptPubKeyMan::GetMetadata(DescriptorScriptPubKeyMan *this,CTxDestination *dest)

{
  int iVar1;
  CKeyMetadata *this_00;
  CTxDestination *in_RDX;
  pointer *__ptr;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock70;
  CKeyID key_id;
  KeyOriginInfo orig;
  unique_lock<std::recursive_mutex> local_70;
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  undefined8 local_30;
  shared_count local_28;
  
  local_28.pi_ = *(sp_counted_base **)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)local_48,in_RDX);
  GetSigningProvider((DescriptorScriptPubKeyMan *)local_60,(CScript *)dest,
                     SUB81((CScript *)local_48,0));
  if (0x1c < local_30._4_4_) {
    free((void *)CONCAT44(local_48._4_4_,local_48._0_4_));
  }
  if ((SigningProvider *)local_60._0_8_ == (SigningProvider *)0x0) {
    (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)0x0;
  }
  else {
    local_48._8_8_ = (void *)0x0;
    local_48._16_8_ = 0;
    local_30 = (element_type *)0x0;
    GetKeyForDestination((CKeyID *)local_60,(SigningProvider *)local_60._0_8_,in_RDX);
    iVar1 = (*(*(_func_int ***)local_60._0_8_)[7])(local_60._0_8_,local_60,local_48);
    if ((char)iVar1 == '\0') {
      if ((void *)local_48._8_8_ != (void *)0x0) {
        operator_delete((void *)local_48._8_8_,(long)local_30 - local_48._8_8_);
      }
      (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)0x0;
    }
    else {
      local_70._M_device =
           (mutex_type *)
           ((long)&dest[7].
                   super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   .
                   super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                   ._M_u + 0x20);
      local_70._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&local_70);
      this_00 = (CKeyMetadata *)operator_new(0x70);
      CKeyMetadata::CKeyMetadata(this_00);
      (this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan = (_func_int **)this_00;
      *(undefined4 *)(this_00->key_origin).fingerprint = local_48._0_4_;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&(this_00->key_origin).path,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_48 + 8));
      this_00->has_key_origin = true;
      this_00->nCreateTime =
           *(int64_t *)
            &dest[5].
             super__Variant_base<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Move_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Copy_assign_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Move_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Copy_ctor_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             .
             super__Variant_storage_alias<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
             ._M_u;
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_70);
      if ((void *)local_48._8_8_ != (void *)0x0) {
        operator_delete((void *)local_48._8_8_,(long)local_30 - local_48._8_8_);
      }
    }
    (*(*(_func_int ***)local_60._0_8_)[1])(local_60._0_8_);
  }
  if (*(sp_counted_base **)(in_FS_OFFSET + 0x28) == local_28.pi_) {
    return (__uniq_ptr_data<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>,_true,_true>
            )(__uniq_ptr_data<wallet::CKeyMetadata,_std::default_delete<wallet::CKeyMetadata>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<CKeyMetadata> DescriptorScriptPubKeyMan::GetMetadata(const CTxDestination& dest) const
{
    std::unique_ptr<SigningProvider> provider = GetSigningProvider(GetScriptForDestination(dest));
    if (provider) {
        KeyOriginInfo orig;
        CKeyID key_id = GetKeyForDestination(*provider, dest);
        if (provider->GetKeyOrigin(key_id, orig)) {
            LOCK(cs_desc_man);
            std::unique_ptr<CKeyMetadata> meta = std::make_unique<CKeyMetadata>();
            meta->key_origin = orig;
            meta->has_key_origin = true;
            meta->nCreateTime = m_wallet_descriptor.creation_time;
            return meta;
        }
    }
    return nullptr;
}